

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,unsigned_long>
          (BaseAppender *this,Vector *col,char input)

{
  unsigned_long uVar1;
  
  uVar1 = Cast::Operation<signed_char,unsigned_long>(input);
  *(unsigned_long *)(col->data + (this->chunk).count * 8) = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}